

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcan_attach.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  ssize_t sVar11;
  bool bVar12;
  char *pcVar13;
  char *__file;
  int ldisc;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  char buf [20];
  
  ldisc = 0x11;
  local_50 = 0;
  local_60 = (char *)0x0;
  local_58 = (char *)0x0;
  local_68 = (char *)0x0;
  bVar1 = false;
  bVar6 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  do {
    bVar12 = bVar6;
    iVar7 = getopt(argc,argv,"ldwocfs:b:n:?");
    bVar2 = true;
    bVar6 = bVar2;
    switch(iVar7) {
    case 0x62:
      local_58 = _optarg;
      sVar10 = strlen(_optarg);
      bVar6 = bVar12;
      if (8 < sVar10) goto switchD_0010145c_caseD_65;
      break;
    case 99:
      bVar6 = bVar12;
      bVar5 = bVar2;
      break;
    case 100:
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x76:
      goto switchD_0010145c_caseD_65;
    case 0x66:
      bVar6 = bVar12;
      bVar4 = bVar2;
      break;
    case 0x6c:
      local_50 = 1;
      bVar6 = bVar12;
      break;
    case 0x6e:
      local_68 = _optarg;
      sVar10 = strlen(_optarg);
      bVar6 = bVar12;
      if (0xf < sVar10) goto switchD_0010145c_caseD_65;
      break;
    case 0x6f:
      bVar6 = bVar12;
      bVar3 = bVar2;
      break;
    case 0x73:
      local_60 = _optarg;
      sVar10 = strlen(_optarg);
      bVar6 = bVar12;
      if (1 < sVar10) {
switchD_0010145c_caseD_65:
        print_usage(*argv);
LAB_001017d1:
        __file = "write";
LAB_001017f8:
        perror(__file);
        exit(1);
      }
      break;
    case 0x77:
      bVar1 = bVar2;
      bVar6 = bVar12;
      break;
    default:
      if ((iVar7 == -1) && (argc - _optind == 1)) {
        __file = argv[_optind];
        iVar7 = open(__file,0x101);
        if (iVar7 < 0) goto LAB_001017f8;
        if (bVar1 || !bVar12) {
          pcVar13 = local_68;
          if (local_60 != (char *)0x0) {
            sprintf(buf,"C\rS%s\r");
            sVar10 = strlen(buf);
            pcVar13 = local_68;
            sVar11 = write(iVar7,buf,sVar10);
            if (sVar11 < 1) goto LAB_001017d1;
          }
          if (local_58 != (char *)0x0) {
            sprintf(buf,"C\rs%s\r");
            sVar10 = strlen(buf);
            sVar11 = write(iVar7,buf,sVar10);
            if (sVar11 < 1) goto LAB_001017d1;
          }
          if (bVar4) {
            buf[2] = '\0';
            buf[0] = 'F';
            buf[1] = '\r';
            sVar10 = strlen(buf);
            sVar11 = write(iVar7,buf,sVar10);
            if (sVar11 < 1) goto LAB_001017d1;
          }
          if ((int)local_50 == 0) {
            if (bVar3) {
              buf[0] = 'O';
              buf[1] = '\r';
              goto LAB_00101639;
            }
          }
          else {
            buf[0] = 'L';
            buf[1] = '\r';
LAB_00101639:
            buf[2] = '\0';
            sVar10 = strlen(buf);
            sVar11 = write(iVar7,buf,sVar10);
            if (sVar11 < 1) goto LAB_001017d1;
          }
          iVar8 = ioctl(iVar7,0x5423,&ldisc);
          if (iVar8 < 0) {
            __file = "ioctl TIOCSETD";
            goto LAB_001017f8;
          }
          iVar8 = ioctl(iVar7,0x8910,&main::ifr);
          if (iVar8 < 0) {
            __file = "ioctl SIOCGIFNAME";
            goto LAB_001017f8;
          }
          printf("attached tty %s to netdevice %s\n",__file,&main::ifr);
          if (pcVar13 != (char *)0x0) {
            iVar8 = socket(2,2,0);
            printf("rename netdevice %s to %s ... ",buf,pcVar13);
            if (iVar8 < 0) {
              perror("socket for interface rename");
            }
            else {
              main::ifr.ifr_ifru.ifru_map.mem_start = 0;
              main::ifr.ifr_ifru.ifru_map.mem_end = 0;
              strncpy(main::ifr.ifr_ifru.ifru_slave,pcVar13,0xf);
              iVar9 = ioctl(iVar8,0x8923,&main::ifr);
              pcVar13 = "ok.";
              if (iVar9 < 0) {
                pcVar13 = "failed!";
              }
              puts(pcVar13);
              close(iVar8);
            }
          }
          if (bVar1) {
            printf("Press any key to detach %s ...\n",__file);
            getchar();
          }
          else if (!bVar12) goto LAB_001017a0;
        }
        ldisc = 0;
        iVar8 = ioctl(iVar7,0x5423);
        if (iVar8 < 0) {
          __file = "ioctl";
          goto LAB_001017f8;
        }
        if (bVar5) {
          buf[2] = '\0';
          buf[0] = 'C';
          buf[1] = '\r';
          sVar10 = strlen(buf);
          sVar11 = write(iVar7,buf,sVar10);
          if (sVar11 < 1) goto LAB_001017d1;
        }
LAB_001017a0:
        close(iVar7);
        return 0;
      }
      goto switchD_0010145c_caseD_65;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int fd;
	int ldisc = N_SLCAN;
	int detach = 0;
	int waitkey = 0;
	int send_open = 0;
	int send_listen = 0;
	int send_close = 0;
	int send_read_status_flags = 0;
	char *speed = NULL;
	char *btr = NULL;
	char buf[20];
	static struct ifreq ifr;
	char *tty;
	char *name = NULL;
	int opt;

	while ((opt = getopt(argc, argv, "ldwocfs:b:n:?")) != -1) {
		switch (opt) {
		case 'd':
			detach = 1;
			break;

		case 'w':
			waitkey = 1;
			break;

		case 'o':
			send_open = 1;
			break;

		case 'l':
			send_listen = 1;
			break;

		case 'c':
			send_close = 1;
			break;

		case 'f':
			send_read_status_flags = 1;
			break;

		case 's':
			speed = optarg;
			if (strlen(speed) > 1)
				print_usage(argv[0]);
			break;

		case 'b':
			btr = optarg;
			if (strlen(btr) > 8)
				print_usage(argv[0]);
			break;

		case 'n':
			name = optarg;
			if (strlen(name) > sizeof(ifr.ifr_newname) - 1)
				print_usage(argv[0]);
			break;

		case '?':
		default:
			print_usage(argv[0]);
			break;
		}
	}

	if (argc - optind != 1)
		print_usage(argv[0]);

	tty = argv[optind];

	if ((fd = open (tty, O_WRONLY | O_NOCTTY)) < 0) {
		perror(tty);
		exit(1);
	}

	if (waitkey || !detach) {

		if (speed) {
			sprintf(buf, "C\rS%s\r", speed);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (btr) {
			sprintf(buf, "C\rs%s\r", btr);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_read_status_flags) {
			sprintf(buf, "F\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_listen) {
			sprintf(buf, "L\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		} else if (send_open) {
			sprintf(buf, "O\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		/* set slcan line discipline on given tty */
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl TIOCSETD");
			exit(1);
		}

		/* retrieve the name of the created CAN netdevice */
		if (ioctl (fd, SIOCGIFNAME, ifr.ifr_name) < 0) {
			perror("ioctl SIOCGIFNAME");
			exit(1);
		}

		printf("attached tty %s to netdevice %s\n", tty, ifr.ifr_name);

		/* try to rename the created device if requested */
		if (name) {
			int s = socket(PF_INET, SOCK_DGRAM, 0);

			printf("rename netdevice %s to %s ... ", buf, name);

			if (s < 0)
				perror("socket for interface rename");
			else {
				/* current slcan%d name is still in ifr.ifr_name */
				memset (ifr.ifr_newname, 0, sizeof(ifr.ifr_newname));
				strncpy (ifr.ifr_newname, name, sizeof(ifr.ifr_newname) - 1);

				if (ioctl(s, SIOCSIFNAME, &ifr) < 0)
					printf("failed!\n");
				else
					printf("ok.\n");

				close(s);
			}
		}
	}

	if (waitkey) {
		printf("Press any key to detach %s ...\n", tty);
		getchar();
	}

	if (waitkey || detach) {
		ldisc = N_TTY;
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl");
			exit(1);
		}

		if (send_close) {
			sprintf(buf, "C\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}
	}

	close(fd);

	return 0;
}